

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

EquivalentTypeCache * __thiscall
Memory::AllocateArray<Memory::Recycler,Js::EquivalentTypeCache,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  EquivalentTypeCache *pEVar4;
  uint *puVar5;
  ulong uVar6;
  size_t byteSize;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pEVar4 = (EquivalentTypeCache *)0x8;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x60),8) == 0) {
      byteSize = SUB168(auVar2 * ZEXT816(0x60),0);
    }
    pEVar4 = (EquivalentTypeCache *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    auVar2 = _DAT_00e0c4f0;
    uVar6 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count * 0x60 - 0x60;
    auVar1 = auVar1 / ZEXT816(0x60);
    auVar8._8_4_ = auVar1._0_4_;
    auVar8._0_8_ = auVar1._0_8_;
    auVar8._12_4_ = auVar1._4_4_;
    puVar5 = &pEVar4->nextEvictionVictim;
    auVar9 = pmovsxbq(in_XMM1,0x302);
    auVar10 = pmovsxbq(in_XMM2,0x100);
    auVar8 = auVar8 ^ _DAT_00e0c4f0;
    do {
      uVar3 = auVar2._0_8_;
      lVar7 = auVar8._0_8_;
      if ((bool)(~(lVar7 < (long)(uVar6 ^ uVar3)) & 1)) {
        *puVar5 = 8;
      }
      auVar11._8_4_ = (int)uVar6;
      auVar11._0_8_ = uVar6;
      auVar11._12_4_ = (int)(uVar6 >> 0x20);
      if ((long)((auVar11._8_8_ | auVar10._8_8_) ^ auVar2._8_8_) <= auVar8._8_8_) {
        puVar5[0x18] = 8;
      }
      if ((long)((uVar6 | auVar9._0_8_) ^ uVar3) <= lVar7) {
        puVar5[0x30] = 8;
        puVar5[0x48] = 8;
      }
      uVar6 = uVar6 + 4;
      puVar5 = puVar5 + 0x60;
    } while ((auVar1._0_8_ + 4U & 0x7fffffffffffffc) != uVar6);
  }
  return pEVar4;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}